

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.cpp
# Opt level: O1

void __thiscall Rml::DataView::DataView(DataView *this,Element *element,int bias)

{
  code *pcVar1;
  bool bVar2;
  Element *this_00;
  
  (this->super_Releasable)._vptr_Releasable = (_func_int **)&PTR__DataView_00334590;
  EnableObserverPtr<Rml::Element>::GetObserverPtr
            ((EnableObserverPtr<Rml::Element> *)&this->attached_element);
  this->sort_order = bias + 1000U;
  if (1999 < bias + 1000U) {
    bVar2 = Assert("RMLUI_ASSERT(bias >= -1000 && bias <= 999)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataView.cpp"
                   ,0x39);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  if (element != (Element *)0x0) {
    for (this_00 = Element::GetParentNode(element); this_00 != (Element *)0x0;
        this_00 = Element::GetParentNode(this_00)) {
      this->sort_order = this->sort_order + 2000;
    }
  }
  return;
}

Assistant:

DataView::DataView(Element* element, int bias) : attached_element(element->GetObserverPtr()), sort_order(bias + 1000)
{
	RMLUI_ASSERT(bias >= -1000 && bias <= 999);

	if (element)
	{
		for (Element* parent = element->GetParentNode(); parent; parent = parent->GetParentNode())
			sort_order += 2000;
	}
}